

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void __thiscall leveldb::VersionSet::~VersionSet(VersionSet *this)

{
  Writer *this_00;
  VersionSet *local_30;
  VersionSet *this_local;
  
  Version::Unref(this->current_);
  if ((this->dummy_versions_).next_ == &this->dummy_versions_) {
    this_00 = this->descriptor_log_;
    if (this_00 != (Writer *)0x0) {
      log::Writer::~Writer(this_00);
      operator_delete(this_00);
    }
    if (this->descriptor_file_ != (WritableFile *)0x0) {
      (*this->descriptor_file_->_vptr_WritableFile[1])();
    }
    local_30 = this + 1;
    do {
      local_30 = (VersionSet *)&local_30[-1].field_0x230;
      std::__cxx11::string::~string((string *)local_30);
    } while (local_30 != (VersionSet *)&this->field_0x170);
    Version::~Version(&this->dummy_versions_);
    InternalKeyComparator::~InternalKeyComparator(&this->icmp_);
    std::__cxx11::string::~string((string *)&this->dbname_);
    return;
  }
  __assert_fail("dummy_versions_.next_ == &dummy_versions_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set.cc"
                ,0x2f3,"leveldb::VersionSet::~VersionSet()");
}

Assistant:

VersionSet::~VersionSet() {
  current_->Unref();
  assert(dummy_versions_.next_ == &dummy_versions_);  // List must be empty
  delete descriptor_log_;
  delete descriptor_file_;
}